

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteCnf2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLutSize;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  uint fVerbose;
  char *pcVar4;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  nLutSize = 6;
  local_40 = 1;
  fVerbose = 0;
  local_44 = local_40;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while (iVar1 = Extra_UtilGetopt(argc,argv,"Kaiovh"), iVar2 = globalUtilOptind,
                iVar1 == 0x76) {
            fVerbose = fVerbose ^ 1;
          }
          if (iVar1 == -1) {
            if (pAbc->pGia == (Gia_Man_t *)0x0) {
              Abc_Print(-1,"IoCommandWriteCnf2(): There is no AIG.\n");
              return 1;
            }
            if (pAbc->pGia->nRegs < 1) {
              if (nLutSize - 9 < 0xfffffffa) {
                Abc_Print(-1,"IoCommandWriteCnf2(): Invalid LUT size (%d).\n");
                return 0;
              }
              if ((local_44 != 0) || (iVar2 = Sdm_ManCanRead(), iVar2 != 0)) {
                if (globalUtilOptind + 1 == argc) {
                  pcVar3 = argv[globalUtilOptind];
                  __stream = fopen(pcVar3,"wb");
                  if (__stream == (FILE *)0x0) {
                    printf("Cannot open file \"%s\" for writing.\n",pcVar3);
                    return 0;
                  }
                  fclose(__stream);
                  if (local_44 == 0) {
                    Jf_ManDumpCnf(pAbc->pGia,pcVar3,fVerbose);
                  }
                  else {
                    Mf_ManDumpCnf(pAbc->pGia,pcVar3,nLutSize,local_3c,local_40,fVerbose);
                  }
                  return 0;
                }
                goto LAB_0028db16;
              }
              pcVar3 = "IoCommandWriteCnf2(): Cannot input precomputed DSD information.\n";
            }
            else {
              pcVar3 = "IoCommandWriteCnf2(): Works only for combinational miters.\n";
            }
            Abc_Print(-1,pcVar3);
            return 0;
          }
          if (iVar1 != 0x6f) break;
          local_40 = local_40 ^ 1;
        }
        if (iVar1 != 0x61) break;
        local_44 = local_44 ^ 1;
      }
      if (iVar1 != 0x69) break;
      local_3c = local_3c ^ 1;
    }
    if (iVar1 != 0x4b) goto LAB_0028db16;
    if (argc <= globalUtilOptind) break;
    nLutSize = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  }
  Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
LAB_0028db16:
  fwrite("usage: &write_cnf [-Kaiovh] <file>\n",0x23,1,(FILE *)pAbc->Err);
  fwrite("\t           writes CNF produced by a new generator\n",0x33,1,(FILE *)pAbc->Err);
  fprintf((FILE *)pAbc->Err,"\t-K <num> : the LUT size (3 <= num <= 8) [default = %d]\n",
          (ulong)nLutSize);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (local_44 == 0) {
    pcVar3 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-a       : toggle using new algorithm [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_3c == 0) {
    pcVar3 = "no";
  }
  fprintf((FILE *)pAbc->Err,
          "\t-i       : toggle using AIG object IDs as CNF variables [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_40 == 0) {
    pcVar3 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-o       : toggle adding OR clause for the outputs [default = %s]\n",
          pcVar3);
  if (fVerbose == 0) {
    pcVar4 = "no";
  }
  fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
          pcVar4);
  fwrite("\t-h       : print the help massage\n",0x23,1,(FILE *)pAbc->Err);
  fwrite("\tfile     : the name of the file to write\n",0x2a,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandWriteCnf2( Abc_Frame_t * pAbc, int argc, char **argv )
{
    extern void Jf_ManDumpCnf( Gia_Man_t * p, char * pFileName, int fVerbose );
    extern void Mf_ManDumpCnf( Gia_Man_t * p, char * pFileName, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
    FILE * pFile;
    char * pFileName;
    int nLutSize    = 6;
    int fNewAlgo    = 1;
    int fCnfObjIds  = 0;
    int fAddOrCla   = 1;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kaiovh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'K':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                    goto usage;
                }
                nLutSize = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                break;
            case 'a':
                fNewAlgo ^= 1;
                break;
            case 'i':
                fCnfObjIds ^= 1;
                break;
            case 'o':
                fAddOrCla ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): There is no AIG.\n" );
        return 1;
    } 
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): Works only for combinational miters.\n" );
        return 0;
    }
    if ( nLutSize < 3 || nLutSize > 8 )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): Invalid LUT size (%d).\n", nLutSize );
        return 0;
    }
    if ( !fNewAlgo && !Sdm_ManCanRead() )
    {
        Abc_Print( -1, "IoCommandWriteCnf2(): Cannot input precomputed DSD information.\n" );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return 0;
    }
    fclose( pFile );
    if ( fNewAlgo )
        Mf_ManDumpCnf( pAbc->pGia, pFileName, nLutSize, fCnfObjIds, fAddOrCla, fVerbose );
    else
        Jf_ManDumpCnf( pAbc->pGia, pFileName, fVerbose );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: &write_cnf [-Kaiovh] <file>\n" );
    fprintf( pAbc->Err, "\t           writes CNF produced by a new generator\n" );
    fprintf( pAbc->Err, "\t-K <num> : the LUT size (3 <= num <= 8) [default = %d]\n", nLutSize );
    fprintf( pAbc->Err, "\t-a       : toggle using new algorithm [default = %s]\n", fNewAlgo? "yes" : "no" );
    fprintf( pAbc->Err, "\t-i       : toggle using AIG object IDs as CNF variables [default = %s]\n", fCnfObjIds? "yes" : "no" );
    fprintf( pAbc->Err, "\t-o       : toggle adding OR clause for the outputs [default = %s]\n", fAddOrCla? "yes" : "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes" : "no" );
    fprintf( pAbc->Err, "\t-h       : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile     : the name of the file to write\n" );
    return 1;
}